

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O3

void __thiscall Assimp::M3DImporter::importMeshes(M3DImporter *this,M3DWrapper *m3d)

{
  uint uVar1;
  m3dv_t *pmVar2;
  iterator iVar3;
  iterator __position;
  iterator __position_00;
  m3dti_t *pmVar4;
  iterator iVar5;
  aiScene *paVar6;
  int iVar7;
  undefined1 auVar8 [16];
  M3DImporter *pMVar9;
  vector<aiMesh*,std::allocator<aiMesh*>> *pvVar10;
  Logger *this_00;
  m3d_t *pmVar11;
  ulong uVar12;
  aiMesh *paVar13;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *this_01;
  value_type *__x;
  uint *puVar14;
  aiMesh **ppaVar15;
  void *pvVar16;
  ulong uVar17;
  void *pvVar18;
  vector<aiFace,_std::allocator<aiFace>_> *faces;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  uint l;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_248;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_240;
  vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *local_238;
  vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *local_230;
  aiMesh *pMesh;
  aiVector3t<float> local_220;
  aiVector3t<float> local_210;
  ulong local_200;
  undefined8 local_1f8;
  float local_1f0;
  long local_1e8 [2];
  M3DImporter *local_1d8;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_1d0;
  vector<aiFace,_std::allocator<aiFace>_> *local_1c8;
  ulong local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [376];
  
  pvVar10 = (vector<aiMesh*,std::allocator<aiMesh*>> *)operator_new(0x18);
  *(undefined8 *)pvVar10 = 0;
  *(undefined8 *)(pvVar10 + 8) = 0;
  *(undefined8 *)(pvVar10 + 0x10) = 0;
  pMesh = (aiMesh *)0x0;
  if (this->mScene == (aiScene *)0x0) {
    __assert_fail("mScene != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x180,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
  }
  if (m3d->m3d_ == (m3d_t *)0x0) {
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x181,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
  }
  if (this->mScene->mRootNode == (aiNode *)0x0) {
    __assert_fail("mScene->mRootNode != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x182,"void Assimp::M3DImporter::importMeshes(const M3DWrapper &)");
  }
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[19]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [19])"M3D: importMeshes ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,(char *)local_1f8);
  local_1d8 = this;
  local_1d0 = pvVar10;
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pmVar11 = m3d->m3d_;
  if (pmVar11->numface == 0) {
    faces = (vector<aiFace,_std::allocator<aiFace>_> *)0x0;
    this_01 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    local_240 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    local_238 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    local_230 = (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)0x0;
    local_248 = (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0;
  }
  else {
    local_200 = CONCAT44(local_200._4_4_,0xfffffffe);
    local_1b8 = 0x437f0000437f0000;
    uStack_1b0 = 0x437f0000437f0000;
    lVar20 = 0;
    uVar17 = 0;
    local_248 = (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0;
    local_230 = (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)0x0;
    local_238 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    local_240 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    this_01 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0;
    faces = (vector<aiFace,_std::allocator<aiFace>_> *)0x0;
    do {
      uVar1 = pmVar11->face[uVar17].materialid;
      uVar12 = (ulong)uVar1;
      local_1c0 = uVar17;
      if ((uint)local_200 != uVar1) {
        local_200 = uVar12;
        if (((this_01 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0 &&
              pMesh != (aiMesh *)0x0) &&
            (faces != (vector<aiFace,_std::allocator<aiFace>_> *)0x0 &&
             *(pointer *)(this_01 + 8) != *(pointer *)this_01)) &&
           ((faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
            super__Vector_impl_data._M_finish !=
            (faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
            super__Vector_impl_data._M_start)) {
          populateMesh(local_1d8,m3d,pMesh,faces,
                       (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,
                       (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_240,
                       (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_238,
                       (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_230,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_248);
          iVar5._M_current = *(aiMesh ***)(local_1d0 + 8);
          if (iVar5._M_current == *(aiMesh ***)(local_1d0 + 0x10)) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      (local_1d0,iVar5,&pMesh);
          }
          else {
            *iVar5._M_current = pMesh;
            *(long *)(local_1d0 + 8) = *(long *)(local_1d0 + 8) + 8;
          }
          std::vector<aiFace,_std::allocator<aiFace>_>::~vector(faces);
          operator_delete(faces,0x18);
          pvVar16 = *(void **)this_01;
          if (pvVar16 != (void *)0x0) {
            operator_delete(pvVar16,(long)*(pointer *)(this_01 + 0x10) - (long)pvVar16);
          }
          operator_delete(this_01,0x18);
          if ((local_240 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0) &&
             (pvVar16 = *(void **)local_240, pvVar16 != (void *)0x0)) {
            operator_delete(pvVar16,(long)*(pointer *)(local_240 + 0x10) - (long)pvVar16);
          }
          operator_delete(local_240,0x18);
          if ((local_238 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0) &&
             (pvVar16 = *(void **)local_238, pvVar16 != (void *)0x0)) {
            operator_delete(pvVar16,(long)*(pointer *)(local_238 + 0x10) - (long)pvVar16);
          }
          operator_delete(local_238,0x18);
          if ((local_230 != (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)0x0) &&
             (pvVar16 = *(void **)local_230, pvVar16 != (void *)0x0)) {
            operator_delete(pvVar16,(long)*(pointer *)(local_230 + 0x10) - (long)pvVar16);
          }
          operator_delete(local_230,0x18);
          if ((local_248 != (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0) &&
             (pvVar16 = *(void **)local_248, pvVar16 != (void *)0x0)) {
            operator_delete(pvVar16,(long)*(pointer *)(local_248 + 0x10) - (long)pvVar16);
          }
          operator_delete(local_248,0x18);
        }
        paVar13 = (aiMesh *)operator_new(0x520);
        paVar13->mNumVertices = 0;
        paVar13->mNumFaces = 0;
        memset(&paVar13->mVertices,0,0xcc);
        paVar13->mBones = (aiBone **)0x0;
        paVar13->mMaterialIndex = 0;
        (paVar13->mName).length = 0;
        (paVar13->mName).data[0] = '\0';
        memset((paVar13->mName).data + 1,0x1b,0x3ff);
        paVar13->mNumAnimMeshes = 0;
        paVar13->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar13->mMethod = 0;
        (paVar13->mAABB).mMin.x = 0.0;
        (paVar13->mAABB).mMin.y = 0.0;
        (paVar13->mAABB).mMin.z = 0.0;
        (paVar13->mAABB).mMax.x = 0.0;
        (paVar13->mAABB).mMax.y = 0.0;
        (paVar13->mAABB).mMax.z = 0.0;
        memset(paVar13->mColors,0,0xa0);
        paVar13->mPrimitiveTypes = 4;
        iVar7 = (int)local_200;
        paVar13->mMaterialIndex = iVar7 + 1;
        pMesh = paVar13;
        local_1c8 = (vector<aiFace,_std::allocator<aiFace>_> *)operator_new(0x18);
        (local_1c8->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_1c8->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_1c8->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_01 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)operator_new(0x18);
        *(undefined8 *)this_01 = 0;
        *(undefined8 *)(this_01 + 8) = 0;
        *(undefined8 *)(this_01 + 0x10) = 0;
        local_240 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                    operator_new(0x18);
        *(undefined8 *)local_240 = 0;
        *(pointer *)(local_240 + 8) = (pointer)0x0;
        *(pointer *)(local_240 + 0x10) = (pointer)0x0;
        local_238 = (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)
                    operator_new(0x18);
        *(undefined8 *)local_238 = 0;
        *(pointer *)(local_238 + 8) = (pointer)0x0;
        *(pointer *)(local_238 + 0x10) = (pointer)0x0;
        local_230 = (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)operator_new(0x18);
        *(undefined8 *)local_230 = 0;
        *(pointer *)(local_230 + 8) = (pointer)0x0;
        *(pointer *)(local_230 + 0x10) = (pointer)0x0;
        local_248 = (vector<unsigned_int,std::allocator<unsigned_int>> *)operator_new(0x18);
        *(undefined8 *)local_248 = 0;
        *(pointer *)(local_248 + 8) = (pointer)0x0;
        *(pointer *)(local_248 + 0x10) = (pointer)0x0;
        local_200 = CONCAT44(local_200._4_4_,iVar7);
        faces = local_1c8;
      }
      local_1c8 = faces;
      __x = (value_type *)operator_new(0x10);
      __x->mIndices = (uint *)0x0;
      __x->mNumIndices = 3;
      puVar14 = (uint *)operator_new__(0xc);
      __x->mIndices = puVar14;
      lVar19 = 0;
      do {
        local_210.x = 0.0;
        local_210.y = 0.0;
        local_210.z = 0.0;
        local_220.x = 0.0;
        local_220.y = 0.0;
        local_220.z = 0.0;
        *(int *)((long)__x->mIndices + lVar19) =
             (int)((ulong)(*(long *)(this_01 + 8) - *(long *)this_01) >> 2) * -0x55555555;
        l = *(uint *)((long)m3d->m3d_->face->vertex + lVar19 + lVar20);
        uVar17 = (ulong)l;
        pmVar2 = m3d->m3d_->vertex;
        local_1f8 = (long *)CONCAT44(pmVar2[uVar17].y,pmVar2[uVar17].x);
        local_1f0 = pmVar2[uVar17].z;
        iVar3._M_current = *(aiVector3t<float> **)(this_01 + 8);
        if (iVar3._M_current == *(aiVector3t<float> **)(this_01 + 0x10)) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>const&>(this_01,iVar3,(aiVector3t<float> *)&local_1f8);
          uVar17 = (ulong)l;
        }
        else {
          (iVar3._M_current)->z = local_1f0;
          *(long **)iVar3._M_current = local_1f8;
          *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0xc;
        }
        uVar1 = m3d->m3d_->vertex[uVar17].color;
        auVar21._12_4_ = (float)(uVar1 >> 0x18);
        auVar21._8_4_ = (float)(uVar1 >> 0x10 & 0xff);
        auVar21._0_4_ = (float)(uVar1 & 0xff);
        auVar21._4_4_ = (float)(uVar1 >> 8 & 0xff);
        auVar8._8_8_ = uStack_1b0;
        auVar8._0_8_ = local_1b8;
        local_1a8._0_16_ = divps(auVar21,auVar8);
        __position._M_current = *(aiColor4t<float> **)(local_230 + 8);
        if (__position._M_current == *(aiColor4t<float> **)(local_230 + 0x10)) {
          std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
          _M_realloc_insert<aiColor4t<float>>(local_230,__position,(aiColor4t<float> *)local_1a8);
          uVar17 = (ulong)l;
        }
        else {
          (__position._M_current)->r = (float)local_1a8._0_4_;
          (__position._M_current)->g = (float)local_1a8._4_4_;
          (__position._M_current)->b = (float)local_1a8._8_4_;
          (__position._M_current)->a = (float)local_1a8._12_4_;
          *(long *)(local_230 + 8) = *(long *)(local_230 + 8) + 0x10;
        }
        pmVar11 = m3d->m3d_;
        if (((pmVar11->vertex[uVar17].skinid < 0xfffffffe) && (pmVar11->skin != (m3ds_t *)0x0)) &&
           (pmVar11->bone != (m3db_t *)0x0)) {
          __position_00._M_current = *(uint **)(local_248 + 8);
          if (__position_00._M_current == *(uint **)(local_248 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_248,__position_00,&l);
          }
          else {
            *__position_00._M_current = (uint)uVar17;
            *(long *)(local_248 + 8) = *(long *)(local_248 + 8) + 4;
          }
        }
        l = *(uint *)((long)m3d->m3d_->face->texcoord + lVar19 + lVar20);
        uVar17 = (ulong)l;
        if (uVar17 != 0xffffffff) {
          pmVar4 = m3d->m3d_->tmap;
          local_210.x = pmVar4[uVar17].u;
          local_210.y = pmVar4[uVar17].v;
          local_210.z = 0.0;
          iVar3._M_current = *(aiVector3t<float> **)(local_238 + 8);
          if (iVar3._M_current == *(aiVector3t<float> **)(local_238 + 0x10)) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>(local_238,iVar3,&local_210);
          }
          else {
            (iVar3._M_current)->z = 0.0;
            (iVar3._M_current)->x = local_210.x;
            (iVar3._M_current)->y = local_210.y;
            *(long *)(local_238 + 8) = *(long *)(local_238 + 8) + 0xc;
          }
        }
        l = *(uint *)((long)m3d->m3d_->face->normal + lVar19 + lVar20);
        uVar17 = (ulong)l;
        if (uVar17 != 0xffffffff) {
          pmVar2 = m3d->m3d_->vertex;
          local_220.x = pmVar2[uVar17].x;
          local_220.y = pmVar2[uVar17].y;
          local_220.z = pmVar2[uVar17].z;
          iVar3._M_current = *(aiVector3t<float> **)(local_240 + 8);
          if (iVar3._M_current == *(aiVector3t<float> **)(local_240 + 0x10)) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>(local_240,iVar3,&local_220);
          }
          else {
            (iVar3._M_current)->z = local_220.z;
            (iVar3._M_current)->x = local_220.x;
            (iVar3._M_current)->y = local_220.y;
            *(long *)(local_240 + 8) = *(long *)(local_240 + 8) + 0xc;
          }
        }
        faces = local_1c8;
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0xc);
      std::vector<aiFace,_std::allocator<aiFace>_>::push_back(local_1c8,__x);
      if (__x->mIndices != (uint *)0x0) {
        operator_delete__(__x->mIndices);
      }
      operator_delete(__x,0x10);
      uVar17 = local_1c0 + 1;
      pmVar11 = m3d->m3d_;
      lVar20 = lVar20 + 0x28;
    } while (uVar17 < pmVar11->numface);
  }
  pvVar10 = local_1d0;
  pMVar9 = local_1d8;
  if (((pMesh != (aiMesh *)0x0) && (*(long *)(this_01 + 8) != *(long *)this_01)) &&
     ((faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (faces->super__Vector_base<aiFace,_std::allocator<aiFace>_>)._M_impl.super__Vector_impl_data.
      _M_start)) {
    populateMesh(local_1d8,m3d,pMesh,faces,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_240,
                 (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_238,
                 (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)local_230,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_248);
    iVar5._M_current = *(aiMesh ***)(pvVar10 + 8);
    if (iVar5._M_current == *(aiMesh ***)(pvVar10 + 0x10)) {
      std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                (pvVar10,iVar5,&pMesh);
    }
    else {
      *iVar5._M_current = pMesh;
      *(long *)(pvVar10 + 8) = *(long *)(pvVar10 + 8) + 8;
    }
  }
  pMVar9->mScene->mNumMeshes = (uint)((ulong)(*(long *)(pvVar10 + 8) - *(long *)pvVar10) >> 3);
  paVar6 = pMVar9->mScene;
  ppaVar15 = (aiMesh **)operator_new__((ulong)paVar6->mNumMeshes << 3);
  paVar6->mMeshes = ppaVar15;
  pvVar16 = *(void **)pvVar10;
  pvVar18 = pvVar16;
  if (*(long *)(pvVar10 + 8) - (long)pvVar16 != 0) {
    memmove(pMVar9->mScene->mMeshes,pvVar16,*(long *)(pvVar10 + 8) - (long)pvVar16);
    pvVar16 = *(void **)(pvVar10 + 8);
    pvVar18 = *(void **)pvVar10;
  }
  pMVar9->mScene->mRootNode->mNumMeshes = (uint)((ulong)((long)pvVar16 - (long)pvVar18) >> 3);
  uVar17 = 0xffffffffffffffff;
  if (-1 < *(long *)(pvVar10 + 8) - *(long *)pvVar10) {
    uVar17 = *(long *)(pvVar10 + 8) - *(long *)pvVar10 >> 1;
  }
  puVar14 = (uint *)operator_new__(uVar17);
  pMVar9->mScene->mRootNode->mMeshes = puVar14;
  pvVar16 = *(void **)pvVar10;
  if (*(void **)(pvVar10 + 8) != pvVar16) {
    uVar17 = 0;
    do {
      pMVar9->mScene->mRootNode->mMeshes[uVar17] = (uint)uVar17;
      uVar17 = (ulong)((uint)uVar17 + 1);
      pvVar16 = *(void **)pvVar10;
    } while (uVar17 < (ulong)(*(long *)(pvVar10 + 8) - (long)pvVar16 >> 3));
  }
  if (pvVar16 != (void *)0x0) {
    operator_delete(pvVar16,*(long *)(pvVar10 + 0x10) - (long)pvVar16);
  }
  operator_delete(pvVar10,0x18);
  if (faces != (vector<aiFace,_std::allocator<aiFace>_> *)0x0) {
    std::vector<aiFace,_std::allocator<aiFace>_>::~vector(faces);
    operator_delete(faces,0x18);
  }
  if (this_01 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0) {
    pvVar16 = *(void **)this_01;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16,*(long *)(this_01 + 0x10) - (long)pvVar16);
    }
    operator_delete(this_01,0x18);
  }
  if (local_240 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0) {
    pvVar16 = *(void **)local_240;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16,*(long *)(local_240 + 0x10) - (long)pvVar16);
    }
    operator_delete(local_240,0x18);
  }
  if (local_238 != (vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)0x0) {
    pvVar16 = *(void **)local_238;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16,*(long *)(local_238 + 0x10) - (long)pvVar16);
    }
    operator_delete(local_238,0x18);
  }
  if (local_230 != (vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)0x0) {
    pvVar16 = *(void **)local_230;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16,*(long *)(local_230 + 0x10) - (long)pvVar16);
    }
    operator_delete(local_230,0x18);
  }
  if (local_248 != (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0) {
    pvVar16 = *(void **)local_248;
    if (pvVar16 != (void *)0x0) {
      operator_delete(pvVar16,*(long *)(local_248 + 0x10) - (long)pvVar16);
    }
    operator_delete(local_248,0x18);
  }
  return;
}

Assistant:

void M3DImporter::importMeshes(const M3DWrapper &m3d) {
	unsigned int i, j, k, l, numpoly = 3, lastMat = M3D_INDEXMAX;
	std::vector<aiMesh *> *meshes = new std::vector<aiMesh *>();
	std::vector<aiFace> *faces = nullptr;
	std::vector<aiVector3D> *vertices = nullptr;
	std::vector<aiVector3D> *normals = nullptr;
	std::vector<aiVector3D> *texcoords = nullptr;
	std::vector<aiColor4D> *colors = nullptr;
	std::vector<unsigned int> *vertexids = nullptr;
	aiMesh *pMesh = nullptr;

	ai_assert(mScene != nullptr);
	ai_assert(m3d);
	ai_assert(mScene->mRootNode != nullptr);

	ASSIMP_LOG_DEBUG_F("M3D: importMeshes ", m3d->numface);

	for (i = 0; i < m3d->numface; i++) {
		// we must switch mesh if material changes
		if (lastMat != m3d->face[i].materialid) {
			lastMat = m3d->face[i].materialid;
			if (pMesh && vertices && vertices->size() && faces && faces->size()) {
				populateMesh(m3d, pMesh, faces, vertices, normals, texcoords, colors, vertexids);
				meshes->push_back(pMesh);
				delete faces;
				delete vertices;
				delete normals;
				delete texcoords;
				delete colors;
				delete vertexids; // this is not stored in pMesh, just to collect bone vertices
			}
			pMesh = new aiMesh;
			pMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
			pMesh->mMaterialIndex = lastMat + 1;
			faces = new std::vector<aiFace>();
			vertices = new std::vector<aiVector3D>();
			normals = new std::vector<aiVector3D>();
			texcoords = new std::vector<aiVector3D>();
			colors = new std::vector<aiColor4D>();
			vertexids = new std::vector<unsigned int>();
		}
		// add a face to temporary vector
		aiFace *pFace = new aiFace;
		pFace->mNumIndices = numpoly;
		pFace->mIndices = new unsigned int[numpoly];
		for (j = 0; j < numpoly; j++) {
			aiVector3D pos, uv, norm;
			k = static_cast<unsigned int>(vertices->size());
			pFace->mIndices[j] = k;
			l = m3d->face[i].vertex[j];
			pos.x = m3d->vertex[l].x;
			pos.y = m3d->vertex[l].y;
			pos.z = m3d->vertex[l].z;
			vertices->push_back(pos);
			colors->push_back(mkColor(m3d->vertex[l].color));
			// add a bone to temporary vector
			if (m3d->vertex[l].skinid != M3D_UNDEF && m3d->vertex[l].skinid != M3D_INDEXMAX && m3d->skin && m3d->bone) {
				// this is complicated, because M3D stores a list of bone id / weight pairs per
				// vertex but assimp uses lists of local vertex id/weight pairs per local bone list
				vertexids->push_back(l);
			}
			l = m3d->face[i].texcoord[j];
			if (l != M3D_UNDEF) {
				uv.x = m3d->tmap[l].u;
				uv.y = m3d->tmap[l].v;
				uv.z = 0.0;
				texcoords->push_back(uv);
			}
			l = m3d->face[i].normal[j];
			if (l != M3D_UNDEF) {
				norm.x = m3d->vertex[l].x;
				norm.y = m3d->vertex[l].y;
				norm.z = m3d->vertex[l].z;
				normals->push_back(norm);
			}
		}
		faces->push_back(*pFace);
		delete pFace;
	}
	// if there's data left in the temporary vectors, flush them
	if (pMesh && vertices->size() && faces->size()) {
		populateMesh(m3d, pMesh, faces, vertices, normals, texcoords, colors, vertexids);
		meshes->push_back(pMesh);
	}

	// create global mesh list in scene
	mScene->mNumMeshes = static_cast<unsigned int>(meshes->size());
	mScene->mMeshes = new aiMesh *[mScene->mNumMeshes];
	std::copy(meshes->begin(), meshes->end(), mScene->mMeshes);

	// create mesh indeces in root node
	mScene->mRootNode->mNumMeshes = static_cast<unsigned int>(meshes->size());
	mScene->mRootNode->mMeshes = new unsigned int[meshes->size()];
	for (i = 0; i < meshes->size(); i++) {
		mScene->mRootNode->mMeshes[i] = i;
	}

	delete meshes;
	if (faces) delete faces;
	if (vertices) delete vertices;
	if (normals) delete normals;
	if (texcoords) delete texcoords;
	if (colors) delete colors;
	if (vertexids) delete vertexids;
}